

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_get_dynamic_(void)

{
  int iVar1;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  return (int)((((__kmp_threads[iVar1]->th).th_current_task)->td_icvs).dynamic != '\0');
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_DYNAMIC)(void) {
#ifdef KMP_STUB
  return __kmps_get_dynamic();
#else
  kmp_info_t *thread;
  thread = __kmp_entry_thread();
  return get__dynamic(thread);
#endif
}